

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low-level.cpp
# Opt level: O2

void __thiscall spatial_region::~spatial_region(spatial_region *this)

{
  pwpo *ppVar1;
  pwpa *ppVar2;
  pwpo *a;
  
  while (ppVar1 = this->p_lapwpo, ppVar1 != (pwpo *)0x0) {
    this->p_lapwpo = ppVar1->previous;
    free(ppVar1->head);
    operator_delete(ppVar1);
  }
  while (ppVar2 = this->p_lapwpa, ppVar2 != (pwpa *)0x0) {
    this->p_lapwpa = ppVar2->previous;
    free(ppVar2->head);
    operator_delete(ppVar2);
  }
  free(this->random);
  free(this->ienergy);
  free(this->ienergy_deleted);
  free(this->N_qp_i);
  std::
  _Vector_base<spatial_region::deleted_particle,_std::allocator<spatial_region::deleted_particle>_>
  ::~_Vector_base(&(this->deleted_particles).
                   super__Vector_base<spatial_region::deleted_particle,_std::allocator<spatial_region::deleted_particle>_>
                 );
  std::vector<field3d<double>,_std::allocator<field3d<double>_>_>::~vector(&this->irho);
  field3d<cellp>::~field3d(&this->cp);
  field3d<cellbe>::~field3d(&this->cbe);
  field3d<cellj>::~field3d(&this->cj);
  field3d<cellb>::~field3d(&this->cb);
  field3d<celle>::~field3d(&this->ce);
  std::__cxx11::string::~string((string *)&this->data_folder);
  std::_Function_base::~_Function_base(&(this->advance_momentum).super__Function_base);
  std::unique_ptr<maxwell_solver,_std::default_delete<maxwell_solver>_>::~unique_ptr(&this->solver);
  return;
}

Assistant:

spatial_region::~spatial_region()
{
    // erasing of particles
    while (p_lapwpo!=0) {
        pwpo* a;
        a = p_lapwpo;
        p_lapwpo = p_lapwpo->previous;
        free((void*) a->head);
        //free(a->head);
        delete a;
    }
    while (p_lapwpa!=0) {
        pwpa* a;
        a = p_lapwpa;
        p_lapwpa = p_lapwpa->previous;
        free((void*) a->head);
        //free(a->head);
        delete a;
    }

    void* pv;

    pv = (void*) random;
    free(pv);

    pv = (void*) ienergy;
    free(pv);
    pv = (void*) ienergy_deleted;
    free(pv);

    pv = (void*) N_qp_i;
    free(pv);
}